

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

string * __thiscall
pbrt::SphericalMapping2D::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SphericalMapping2D *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::Transform_const&>
            (__return_storage_ptr__,"[ SphericalMapping2D textureFromRender: %s ]",
             &this->textureFromRender);
  return __return_storage_ptr__;
}

Assistant:

std::string SphericalMapping2D::ToString() const {
    return StringPrintf("[ SphericalMapping2D textureFromRender: %s ]",
                        textureFromRender);
}